

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O0

bool __thiscall Clasp::SatElite::bceVe(SatElite *this,Var v,uint32 maxCnt)

{
  uint uVar1;
  ValueRep VVar2;
  bool bVar3;
  uint32 uVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  Clause *pCVar8;
  Clause *pCVar9;
  SatElite *pSVar10;
  reference puVar11;
  SatElite *pSVar12;
  uint in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  ClRange CVar13;
  const_iterator it_2;
  uint32 i_2;
  size_type i_1;
  ClIter it;
  bool freeId;
  ClIter it_1;
  const_iterator j;
  const_iterator i;
  Clause *rhs;
  Clause *lhs;
  bool stop;
  uint32 blocked;
  uint32 markMax;
  uint32 cnt;
  ClRange cls;
  uint32 bce;
  Solver *s;
  Var in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  Var in_stack_ffffffffffffff24;
  Literal *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint32 in_stack_ffffffffffffff34;
  size_type sVar14;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  SatElite *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  SatElite *in_stack_ffffffffffffff70;
  size_type local_88;
  size_type local_84;
  Literal *local_80;
  Literal *local_70;
  SatElite *local_68;
  Clause *rhs_00;
  Clause *in_stack_ffffffffffffffa8;
  Clause *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  int local_40;
  uint local_3c;
  Literal *local_38;
  Literal *local_30;
  bool local_1;
  
  SharedContext::master((SharedContext *)0x24b5d3);
  VVar2 = Solver::value((Solver *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c);
  if (VVar2 == '\0') {
    bk_lib::
    pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
    ::clear((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
             *)(in_RDI + 0xa8));
    uVar4 = SatPreParams::bce(*(SatPreParams **)(in_RDI + 0x20));
    CVar13 = splitOcc((SatElite *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (Var)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffff58 >> 0x18,0));
    local_3c = 0;
    sVar5 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x98));
    local_40 = sVar5 * (1 < uVar4);
    sVar5 = 0;
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 & 0xffffff;
    pCVar8 = (Clause *)
             bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x88));
    while( true ) {
      rhs_00 = pCVar8;
      pCVar9 = (Clause *)
               bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x88)
                         );
      uVar1 = in_stack_ffffffffffffff64 & 0xffffff;
      if (pCVar8 != pCVar9) {
        uVar1 = CONCAT13((char)(in_stack_ffffffffffffffb8 >> 0x18),(int3)in_stack_ffffffffffffff64)
                ^ 0xff000000;
      }
      in_stack_ffffffffffffff64 = uVar1;
      if ((in_stack_ffffffffffffff64 & 0x1000000) == 0) break;
      in_stack_ffffffffffffffb0 =
           SatPreprocessor::clause
                     ((SatPreprocessor *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff1c);
      SatPreprocessor::Clause::operator[](in_stack_ffffffffffffffb0,0);
      SatPreprocessor::Clause::size(in_stack_ffffffffffffffb0);
      markAll(in_stack_ffffffffffffff40,
              (Literal *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
              in_stack_ffffffffffffff34);
      SatPreprocessor::Clause::setMarked(in_stack_ffffffffffffffb0,uVar4 != 0);
      local_68 = (SatElite *)
                 bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            (in_RDI + 0x98));
      while (pSVar12 = local_68,
            pSVar10 = (SatElite *)
                      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (in_RDI + 0x98)), pSVar12 != pSVar10) {
        in_stack_ffffffffffffffa8 =
             SatPreprocessor::clause
                       ((SatPreprocessor *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c);
        bVar3 = trivialResolvent(pSVar12,(Clause *)in_stack_ffffffffffffff40,
                                 in_stack_ffffffffffffff3c);
        if (!bVar3) {
          bVar3 = SatPreprocessor::Clause::marked(in_stack_ffffffffffffffa8);
          local_40 = local_40 - (uint)bVar3;
          SatPreprocessor::Clause::setMarked(in_stack_ffffffffffffffa8,false);
          SatPreprocessor::Clause::setMarked(in_stack_ffffffffffffffb0,false);
          local_3c = local_3c + 1;
          if (in_EDX < local_3c) {
            if (local_40 == 0) {
              in_stack_ffffffffffffffb8 = CONCAT13(uVar4 == 0,(int3)in_stack_ffffffffffffffb8);
              break;
            }
          }
          else {
            bk_lib::
            pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
            ::push_back((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                         *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (Clause **)in_stack_ffffffffffffff28);
            bk_lib::
            pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
            ::push_back((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                         *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (Clause **)in_stack_ffffffffffffff28);
          }
        }
        local_68 = (SatElite *)((long)&(local_68->super_SatPreprocessor)._vptr_SatPreprocessor + 4);
      }
      in_stack_ffffffffffffff40 =
           (SatElite *)SatPreprocessor::Clause::operator[](in_stack_ffffffffffffffb0,0);
      SatPreprocessor::Clause::size(in_stack_ffffffffffffffb0);
      unmarkAll((SatElite *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      bVar3 = SatPreprocessor::Clause::marked(in_stack_ffffffffffffffb0);
      if (bVar3) {
        in_stack_ffffffffffffff3c = *(uint *)&rhs_00->data_;
        sVar6 = sVar5 + 1;
        puVar11 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             (in_RDI + 0x88),sVar5);
        *puVar11 = in_stack_ffffffffffffff3c;
        sVar5 = sVar6;
      }
      pCVar8 = (Clause *)((long)&rhs_00->data_ + 4);
    }
    if (in_EDX < local_3c) {
      if (sVar5 + local_40 != 0) {
        for (local_88 = 0; local_88 != sVar5; local_88 = local_88 + 1) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x88),
                     local_88);
          bceVeRemove(in_stack_ffffffffffffff70,(uint32)((ulong)in_RDI >> 0x20),
                      SUB81((ulong)in_RDI >> 0x18,0),in_stack_ffffffffffffff64,
                      SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
        }
        pSVar12 = (SatElite *)
                  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             (in_RDI + 0x98));
        while (local_40 != 0) {
          pCVar8 = SatPreprocessor::clause
                             ((SatPreprocessor *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff1c);
          bVar3 = SatPreprocessor::Clause::marked(pCVar8);
          if (bVar3) {
            bceVeRemove(pSVar12,(uint32)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                        in_stack_ffffffffffffff64,SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
            local_40 = local_40 + -1;
          }
          pSVar12 = (SatElite *)((long)&(pSVar12->super_SatPreprocessor)._vptr_SatPreprocessor + 4);
        }
      }
    }
    else {
      SharedContext::eliminate
                ((SharedContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
      local_38 = CVar13.first;
      for (local_70 = local_38; local_30 = CVar13.second, local_70 != local_30;
          local_70 = local_70 + 1) {
        Literal::var(local_70);
        pCVar8 = SatPreprocessor::clause
                           ((SatPreprocessor *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff1c);
        if (pCVar8 != (Clause *)0x0) {
          if (local_3c != 0) {
            local_3c = local_3c - 1;
          }
          Literal::var(local_70);
          bceVeRemove(in_stack_ffffffffffffff70,(uint32)((ulong)in_RDI >> 0x20),
                      SUB81((ulong)in_RDI >> 0x18,0),in_stack_ffffffffffffff64,
                      SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0));
        }
      }
      local_80 = local_38;
      local_84 = 0;
      while (sVar14 = local_84,
            sVar7 = bk_lib::
                    pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                    ::size((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                            *)(in_RDI + 0xa8)), sVar14 != sVar7) {
        in_stack_ffffffffffffff24 = Literal::var(local_80);
        bk_lib::
        pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
        ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                      *)(in_RDI + 0xa8),local_84);
        bk_lib::
        pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
        ::operator[]((pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
                      *)(in_RDI + 0xa8),local_84 + 1);
        bVar3 = addResolvent((SatElite *)CONCAT44(sVar5,in_stack_ffffffffffffffb8),
                             (uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                             in_stack_ffffffffffffffa8,rhs_00);
        if (!bVar3) {
          return false;
        }
        local_84 = local_84 + 2;
        local_80 = local_80 + 1;
      }
      OccurList::clear((OccurList *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    local_1 = true;
    if ((**(ulong **)(in_RDI + 0x20) >> 2 & 0x7ff) == 0) {
      local_1 = backwardSubsume((SatElite *)CONCAT44(in_ESI,in_EDX));
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SatElite::bceVe(Var v, uint32 maxCnt) {
	Solver* s = ctx_->master();
	if (s->value(v) != value_free) return true;
	assert(!ctx_->varInfo(v).frozen() && !ctx_->eliminated(v));
	resCands_.clear();
	// distribute clauses on v
	// check if number of clauses decreases if we'd eliminate v
	uint32 bce     = opts_->bce();
	ClRange cls    = splitOcc(v, bce > 1);
	uint32 cnt     = 0;
	uint32 markMax = ((uint32)occT_[neg].size() * (bce>1));
	uint32 blocked = 0;
	bool stop      = false;
	Clause* lhs, *rhs;
	for (VarVec::const_iterator i = occT_[pos].begin(); i != occT_[pos].end() && !stop; ++i) {
		lhs         = clause(*i);
		markAll(&(*lhs)[0], lhs->size());
		lhs->setMarked(bce != 0);
		for (VarVec::const_iterator j = occT_[neg].begin(); j != occT_[neg].end(); ++j) {
			if (!trivialResolvent(*(rhs = clause(*j)), v)) {
				markMax -= rhs->marked();
				rhs->setMarked(false); // not blocked on v
				lhs->setMarked(false); // not blocked on v
				if (++cnt <= maxCnt) {
					resCands_.push_back(lhs);
					resCands_.push_back(rhs);
				}
				else if (!markMax) {
					stop = (bce == 0);
					break;
				}
			}
		}
		unmarkAll(&(*lhs)[0], lhs->size());
		if (lhs->marked()) {
			occT_[pos][blocked++] = *i;
		}
	}
	if (cnt <= maxCnt) {
		// eliminate v by clause distribution
		ctx_->eliminate(v);  // mark var as eliminated
		// remove old clauses, store them in the elimination table so that
		// (partial) models can be extended.
		for (ClIter it = cls.first; it != cls.second; ++it) {
			// reuse first cnt ids for resolvents
			if (clause(it->var())) {
				bool freeId = (cnt && cnt--);
				bceVeRemove(it->var(), freeId, v, false);
			}
		}
		// add non trivial resolvents
		assert( resCands_.size() % 2 == 0 );
		ClIter it = cls.first;
		for (VarVec::size_type i = 0; i != resCands_.size(); i+=2, ++it) {
			if (!addResolvent(it->var(), *resCands_[i], *resCands_[i+1])) {
				return false;
			}
		}
		assert(occurs_[v].numOcc() == 0);
		// release memory
		occurs_[v].clear();
	}
	else if ( (blocked + markMax) > 0 ) {
		// remove blocked clauses
		for (uint32 i = 0; i != blocked; ++i) {
			bceVeRemove(occT_[pos][i], false, v, true);
		}
		for (VarVec::const_iterator it = occT_[neg].begin(); markMax; ++it) {
			if ( (rhs = clause(*it))->marked() ) {
				bceVeRemove(*it, false, v, true);
				--markMax;
			}
		}
	}
	return opts_->limIters != 0 || backwardSubsume();
}